

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GPUShaderFP64Test1::verifyErrorGenerationWhenCallingDoubleUniformFunctionsWithNegativeCount
          (GPUShaderFP64Test1 *this)

{
  GPUShaderFP64Test1 *this_00;
  _uniform_function func;
  int iVar1;
  undefined4 extraout_var;
  char *__s;
  size_t sVar2;
  TestError *this_01;
  long lVar3;
  bool bVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  GPUShaderFP64Test1 *this_02;
  long lVar7;
  GLdouble double_values [16];
  undefined8 auStack_238 [17];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  puVar5 = &DAT_01a3b3e0;
  puVar6 = auStack_238;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar6 = *puVar5;
    puVar5 = puVar5 + 1;
    puVar6 = puVar6 + 1;
  }
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  this_00 = (GPUShaderFP64Test1 *)(local_1b0 + 8);
  bVar4 = true;
  lVar7 = 0;
  do {
    func = *(_uniform_function *)((long)&DAT_01a3b3a0 + lVar7);
    switch(func) {
    case UNIFORM_FUNCTION_1DV:
      (**(code **)(lVar3 + 0x14d8))(this->m_po_double_arr_uniform_location,0xffffffff,auStack_238);
      break;
    default:
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Unrecognized uniform function",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0xad5);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    case UNIFORM_FUNCTION_2DV:
      (**(code **)(lVar3 + 0x1518))(this->m_po_dvec2_arr_uniform_location,0xffffffff,auStack_238);
      break;
    case UNIFORM_FUNCTION_3DV:
      (**(code **)(lVar3 + 0x1558))(this->m_po_dvec3_arr_uniform_location,0xffffffff,auStack_238);
      break;
    case UNIFORM_FUNCTION_4DV:
      (**(code **)(lVar3 + 0x1598))(this->m_po_dvec4_arr_uniform_location,0xffffffff,auStack_238);
      break;
    case UNIFORM_FUNCTION_MATRIX2DV:
      (**(code **)(lVar3 + 0x15d8))(this->m_po_dmat2_arr_uniform_location,0xffffffff,0,auStack_238);
      break;
    case UNIFORM_FUNCTION_MATRIX2X3DV:
      (**(code **)(lVar3 + 0x15e8))
                (this->m_po_dmat2x3_arr_uniform_location,0xffffffff,0,auStack_238);
      break;
    case UNIFORM_FUNCTION_MATRIX2X4DV:
      (**(code **)(lVar3 + 0x15f8))
                (this->m_po_dmat2x4_arr_uniform_location,0xffffffff,0,auStack_238);
      break;
    case UNIFORM_FUNCTION_MATRIX3DV:
      (**(code **)(lVar3 + 0x1608))(this->m_po_dmat3_arr_uniform_location,0xffffffff,0,auStack_238);
      break;
    case UNIFORM_FUNCTION_MATRIX3X2DV:
      (**(code **)(lVar3 + 0x1618))
                (this->m_po_dmat3x2_arr_uniform_location,0xffffffff,0,auStack_238);
      break;
    case UNIFORM_FUNCTION_MATRIX3X4DV:
      (**(code **)(lVar3 + 0x1628))
                (this->m_po_dmat3x4_arr_uniform_location,0xffffffff,0,auStack_238);
      break;
    case UNIFORM_FUNCTION_MATRIX4DV:
      (**(code **)(lVar3 + 0x1638))(this->m_po_dmat4_arr_uniform_location,0xffffffff,0,auStack_238);
      break;
    case UNIFORM_FUNCTION_MATRIX4X2DV:
      (**(code **)(lVar3 + 0x1648))
                (this->m_po_dmat4x2_arr_uniform_location,0xffffffff,0,auStack_238);
      break;
    case UNIFORM_FUNCTION_MATRIX4X3DV:
      (**(code **)(lVar3 + 0x1658))
                (this->m_po_dmat4x3_arr_uniform_location,0xffffffff,0,auStack_238);
    }
    iVar1 = (**(code **)(lVar3 + 0x800))();
    if (iVar1 != 0x501) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      this_02 = this_00;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Function ",9);
      __s = getUniformFunctionString(this_02,func);
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,
                 "() was called with a negative count argument but did not generate a GL_INVALID_VALUE error"
                 ,0x5a);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
      std::ios_base::~ios_base(local_138);
      bVar4 = false;
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x34);
  return bVar4;
}

Assistant:

bool GPUShaderFP64Test1::verifyErrorGenerationWhenCallingDoubleUniformFunctionsWithNegativeCount()
{
	const glw::GLdouble double_values[16] = { 1.0, 2.0,  3.0,  4.0,  5.0,  6.0,  7.0,  8.0,
											  9.0, 10.0, 11.0, 12.0, 13.0, 14.0, 15.0, 16.0 };
	const glw::Functions&   gl					= m_context.getRenderContext().getFunctions();
	bool					result				= true;
	const _uniform_function uniform_functions[] = { UNIFORM_FUNCTION_1DV,		  UNIFORM_FUNCTION_2DV,
													UNIFORM_FUNCTION_3DV,		  UNIFORM_FUNCTION_4DV,
													UNIFORM_FUNCTION_MATRIX2DV,   UNIFORM_FUNCTION_MATRIX2X3DV,
													UNIFORM_FUNCTION_MATRIX2X4DV, UNIFORM_FUNCTION_MATRIX3DV,
													UNIFORM_FUNCTION_MATRIX3X2DV, UNIFORM_FUNCTION_MATRIX3X4DV,
													UNIFORM_FUNCTION_MATRIX4DV,   UNIFORM_FUNCTION_MATRIX4X2DV,
													UNIFORM_FUNCTION_MATRIX4X3DV };
	const unsigned int n_uniform_functions = sizeof(uniform_functions) / sizeof(uniform_functions[0]);

	for (unsigned int n_uniform_function = 0; n_uniform_function < n_uniform_functions; ++n_uniform_function)
	{
		_uniform_function uniform_function = uniform_functions[n_uniform_function];

		switch (uniform_function)
		{
		case UNIFORM_FUNCTION_1DV:
			gl.uniform1dv(m_po_double_arr_uniform_location, -1, double_values);
			break;
		case UNIFORM_FUNCTION_2DV:
			gl.uniform2dv(m_po_dvec2_arr_uniform_location, -1, double_values);
			break;
		case UNIFORM_FUNCTION_3DV:
			gl.uniform3dv(m_po_dvec3_arr_uniform_location, -1, double_values);
			break;
		case UNIFORM_FUNCTION_4DV:
			gl.uniform4dv(m_po_dvec4_arr_uniform_location, -1, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX2DV:
			gl.uniformMatrix2dv(m_po_dmat2_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX2X3DV:
			gl.uniformMatrix2x3dv(m_po_dmat2x3_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX2X4DV:
			gl.uniformMatrix2x4dv(m_po_dmat2x4_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX3DV:
			gl.uniformMatrix3dv(m_po_dmat3_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX3X2DV:
			gl.uniformMatrix3x2dv(m_po_dmat3x2_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX3X4DV:
			gl.uniformMatrix3x4dv(m_po_dmat3x4_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX4DV:
			gl.uniformMatrix4dv(m_po_dmat4_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX4X2DV:
			gl.uniformMatrix4x2dv(m_po_dmat4x2_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX4X3DV:
			gl.uniformMatrix4x3dv(m_po_dmat4x3_arr_uniform_location, -1, GL_FALSE, double_values);
			break;

		default:
		{
			TCU_FAIL("Unrecognized uniform function");
		}
		} /* switch (uniform_function) */

		/* Make sure GL_INVALID_VALUE was generated */
		glw::GLenum error_code = gl.getError();

		if (error_code != GL_INVALID_VALUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Function " << getUniformFunctionString(uniform_function)
							   << "() "
								  "was called with a negative count argument but did not generate a "
								  "GL_INVALID_VALUE error"
							   << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all uniform functions) */

	return result;
}